

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall BuildStatus::BuildEdgeStarted(BuildStatus *this,Edge *edge)

{
  bool bVar1;
  iterator iVar2;
  int64_t iVar3;
  Edge *edge_local;
  pair<const_Edge_*,_int> local_20;
  
  edge_local = edge;
  iVar2 = std::
          _Rb_tree<const_Edge_*,_std::pair<const_Edge_*const,_int>,_std::_Select1st<std::pair<const_Edge_*const,_int>_>,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
          ::find(&(this->running_edges_)._M_t,&edge_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar3 = GetTimeMillis();
    local_20.second = (int)iVar3 - (int)this->start_time_millis_;
    local_20.first = edge_local;
    std::
    _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
    ::_M_emplace_unique<std::pair<Edge_const*,int>>
              ((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                *)&this->running_edges_,&local_20);
    this->started_edges_ = this->started_edges_ + 1;
    bVar1 = Edge::use_console(edge_local);
    if ((bVar1) || ((this->printer_).smart_terminal_ == true)) {
      PrintStatus(this,edge_local,kEdgeStarted);
    }
    bVar1 = Edge::use_console(edge_local);
    if (bVar1) {
      LinePrinter::SetConsoleLocked(&this->printer_,true);
    }
    return;
  }
  __assert_fail("running_edges_.find(edge) == running_edges_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                ,99,"void BuildStatus::BuildEdgeStarted(const Edge *)");
}

Assistant:

void BuildStatus::BuildEdgeStarted(const Edge* edge) {
  assert(running_edges_.find(edge) == running_edges_.end());
  int start_time = (int)(GetTimeMillis() - start_time_millis_);
  running_edges_.insert(make_pair(edge, start_time));
  ++started_edges_;

  if (edge->use_console() || printer_.is_smart_terminal())
    PrintStatus(edge, kEdgeStarted);

  if (edge->use_console())
    printer_.SetConsoleLocked(true);
}